

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Lib::Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList>_>::expand
          (Stack<Lib::Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList>_> *this)

{
  Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *__ptr;
  Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *pCVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  sVar4 = 8;
  if (this->_capacity != 0) {
    sVar4 = this->_capacity * 2;
  }
  pCVar1 = (Coproduct<Kernel::Formula_*,_Kernel::Literal_*,_Kernel::TermList> *)
           Lib::alloc(sVar4 * 0xc);
  sVar3 = this->_capacity;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    __ptr = this->_stack;
    lVar2 = 0;
    while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
      *(undefined4 *)((pCVar1->_inner)._content + lVar2 + 7) =
           *(undefined4 *)((__ptr->_inner)._content + lVar2 + 7);
      *(undefined8 *)((pCVar1->_inner)._content + lVar2 + -1) =
           *(undefined8 *)((__ptr->_inner)._content + lVar2 + -1);
      lVar2 = lVar2 + 0xc;
    }
    Lib::free(__ptr);
    sVar3 = this->_capacity;
  }
  this->_stack = pCVar1;
  this->_cursor = pCVar1 + sVar3;
  this->_end = pCVar1 + sVar4;
  this->_capacity = sVar4;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }